

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartSharedAttributes.cpp
# Opt level: O0

void anon_unknown.dwarf_188870::testPixelAspectRatio
               (vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *hs,string *fn)

{
  float fVar1;
  int iVar2;
  int iVar3;
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *headers_00;
  string *failMessage;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  value_type *__x;
  Header newHeader;
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> headers;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe98;
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *this_00;
  Vec2<float> *this_01;
  float fVar4;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *in_stack_fffffffffffffee0;
  string *fn_00;
  allocator<char> local_101;
  string local_100 [36];
  Channel local_dc [19];
  undefined1 local_c9 [33];
  string local_a8 [36];
  Vec2<float> local_84;
  int local_78;
  int local_68;
  Header local_60 [56];
  string local_28;
  
  fn_00 = &local_28;
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::vector
            (in_stack_fffffffffffffee0,
             (vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
             CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
            ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)fn_00,0);
  headers_00 = (vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
               Imf_3_4::Header::displayWindow();
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::size
            ((Box<Imath_3_2::Vec2<int>_> *)in_stack_fffffffffffffe98);
  iVar2 = local_68 + 1;
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
            ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)&local_28,0);
  failMessage = (string *)Imf_3_4::Header::displayWindow();
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::size
            ((Box<Imath_3_2::Vec2<int>_> *)in_stack_fffffffffffffe98);
  iVar3 = local_78 + 1;
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
            ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)&local_28,0);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         Imf_3_4::Header::pixelAspectRatio();
  fVar1 = *(float *)this;
  fVar4 = 1.0;
  this_01 = &local_84;
  Imath_3_2::Vec2<float>::Vec2(this_01,0.0,0.0);
  Imf_3_4::Header::Header
            (local_60,iVar2,iVar3,fVar1 + 1.0,(Vec2 *)this_01,fVar4,INCREASING_Y,ZIP_COMPRESSION);
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
            ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)&local_28,0);
  Imf_3_4::Header::type_abi_cxx11_();
  Imf_3_4::Header::setType((string *)local_60);
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
            ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)&local_28,0);
  Imf_3_4::Header::name_abi_cxx11_();
  this_00 = (vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)local_c9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,(char *)CONCAT44(iVar3,fVar4),(allocator<char> *)this_01);
  std::operator+(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  Imf_3_4::Header::setName((string *)local_60);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string((string *)(local_c9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_c9);
  __x = (value_type *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel(local_dc,HALF,1,1,false);
  Imf_3_4::ChannelList::insert((char *)__x,(Channel *)"Dummy");
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::push_back(this_00,__x);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,(char *)CONCAT44(iVar3,fVar4),(allocator<char> *)this_01);
  testMultiPartOutputFileForExpectedFailure(headers_00,fn_00,failMessage);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator(&local_101);
  Imf_3_4::Header::~Header(local_60);
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::~vector(this_00);
  return;
}

Assistant:

void
testPixelAspectRatio (const vector<Header>& hs, const std::string& fn)
{
    vector<Header> headers (hs);

    Header newHeader (
        headers[0].displayWindow ().size ().x + 1,
        headers[0].displayWindow ().size ().y + 1,
        headers[0].pixelAspectRatio () + 1.f);
    newHeader.setType (headers[0].type ());
    newHeader.setName (headers[0].name () + string ("_newHeader"));
    newHeader.channels ().insert ("Dummy", Channel ());
    headers.push_back (newHeader);
    testMultiPartOutputFileForExpectedFailure (
        headers,
        fn,
        "Shared Attributes : pixelAspecRatio : should fail for !=values");

    return;
}